

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_crt_check_cn(mbedtls_x509_buf *name,char *cn,size_t cn_len)

{
  int iVar1;
  size_t cn_len_local;
  char *cn_local;
  mbedtls_x509_buf *name_local;
  
  if ((name->len == cn_len) && (iVar1 = x509_memcasecmp(cn,name->p,cn_len), iVar1 == 0)) {
    return 0;
  }
  iVar1 = x509_check_wildcard(cn,name);
  if (iVar1 == 0) {
    name_local._4_4_ = 0;
  }
  else {
    name_local._4_4_ = -1;
  }
  return name_local._4_4_;
}

Assistant:

static int x509_crt_check_cn(const mbedtls_x509_buf *name,
                             const char *cn, size_t cn_len)
{
    /* try exact match */
    if (name->len == cn_len &&
        x509_memcasecmp(cn, name->p, cn_len) == 0) {
        return 0;
    }

    /* try wildcard match */
    if (x509_check_wildcard(cn, name) == 0) {
        return 0;
    }

    return -1;
}